

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

void __thiscall
duckdb::StrfTimeFormat::ConvertDateVector
          (StrfTimeFormat *this,Vector *input,Vector *result,idx_t count)

{
  ulong *puVar1;
  anon_union_16_2_67f50693_for_value *paVar2;
  int32_t *piVar3;
  unsigned_long *puVar4;
  data_ptr_t pdVar5;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  byte bVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  SelectionVector *pSVar11;
  data_ptr_t pdVar12;
  TemplatedValidityData<unsigned_long> *pTVar13;
  void *pvVar14;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t iVar15;
  idx_t extraout_RDX_01;
  idx_t idx;
  ulong uVar16;
  idx_t iVar17;
  ulong uVar18;
  data_ptr_t pdVar19;
  idx_t *piVar20;
  idx_t idx_in_entry;
  ulong uVar21;
  __shared_count<(__gnu_cxx::_Lock_policy)2> args;
  ulong uVar22;
  string_t sVar23;
  anon_struct_16_3_d7536bce_for_pointer aVar24;
  ValidityMask local_c8;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  data_ptr_t local_90;
  void *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)this;
  local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)result;
  if (input->vector_type == FLAT_VECTOR) {
    pvVar14 = (void *)count;
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar19 = result->data;
    pdVar5 = input->data;
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    if ((input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        piVar20 = (idx_t *)(pdVar19 + 8);
        iVar17 = 0;
        iVar15 = extraout_RDX;
        do {
          sVar23 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)(pdVar5 + iVar17 * 4),&local_c8,iVar15,pvVar14);
          iVar15 = sVar23.value._8_8_;
          piVar20[-1] = sVar23.value._0_8_;
          *piVar20 = iVar15;
          iVar17 = iVar17 + 1;
          piVar20 = piVar20 + 2;
        } while (count != iVar17);
      }
    }
    else {
      args._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&input->validity;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity = count;
      local_a8 = (element_type *)count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long **)args._M_pi,(unsigned_long *)&local_a8);
      pdVar12 = local_78.data;
      pSVar11 = local_78.sel;
      local_78.sel = (SelectionVector *)0x0;
      local_78.data = (data_ptr_t)0x0;
      p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)pSVar11;
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar12;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
      }
      pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                            validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)
           (pTVar13->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
      if (0x3f < count + 0x3f) {
        local_c8.super_TemplatedValidityMask<unsigned_long>.capacity = count + 0x3f >> 6;
        pdVar19 = pdVar19 + 8;
        pvVar14 = (void *)0x0;
        iVar15 = extraout_RDX_00;
        uVar21 = 0;
        local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = args._M_pi;
        local_90 = pdVar19;
        do {
          puVar4 = ((TemplatedValidityMask<unsigned_long> *)&(args._M_pi)->_vptr__Sp_counted_base)->
                   validity_mask;
          if (puVar4 == (unsigned_long *)0x0) {
            uVar16 = 0xffffffffffffffff;
          }
          else {
            uVar16 = puVar4[(long)pvVar14];
          }
          uVar18 = uVar21 + 0x40;
          if (count <= uVar21 + 0x40) {
            uVar18 = count;
          }
          uVar22 = uVar18;
          local_88 = pvVar14;
          if (uVar16 != 0) {
            uVar22 = uVar21;
            if (uVar16 == 0xffffffffffffffff) {
              if (uVar21 < uVar18) {
                piVar20 = (idx_t *)(pdVar19 + uVar21 * 0x10);
                do {
                  sVar23 = UnaryLambdaWrapperWithNulls::
                           Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                                     ((date_t)*(int32_t *)(pdVar5 + uVar21 * 4),&local_c8,iVar15,
                                      pvVar14);
                  iVar15 = sVar23.value._8_8_;
                  piVar20[-1] = sVar23.value._0_8_;
                  *piVar20 = iVar15;
                  uVar21 = uVar21 + 1;
                  piVar20 = piVar20 + 2;
                  uVar22 = uVar21;
                } while (uVar18 != uVar21);
              }
            }
            else {
              args._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                           internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
              if (uVar21 < uVar18) {
                piVar20 = (idx_t *)(pdVar19 + uVar21 * 0x10);
                uVar22 = 0;
                do {
                  if ((uVar16 >> (uVar22 & 0x3f) & 1) != 0) {
                    sVar23 = UnaryLambdaWrapperWithNulls::
                             Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                                       ((date_t)*(int32_t *)(pdVar5 + uVar22 * 4 + uVar21 * 4),
                                        &local_c8,iVar15,pvVar14);
                    iVar15 = sVar23.value._8_8_;
                    piVar20[-1] = sVar23.value._0_8_;
                    *piVar20 = iVar15;
                  }
                  uVar22 = uVar22 + 1;
                  piVar20 = piVar20 + 2;
                } while ((uVar21 - uVar18) + uVar22 != 0);
                uVar22 = uVar21 + uVar22;
                args._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                             internal.
                             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
                pdVar19 = local_90;
              }
            }
          }
          pvVar14 = (void *)((long)local_88 + 1);
          uVar21 = uVar22;
        } while (pvVar14 != (void *)local_c8.super_TemplatedValidityMask<unsigned_long>.capacity);
      }
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    paVar2 = (anon_union_16_2_67f50693_for_value *)result->data;
    piVar3 = (int32_t *)input->data;
    puVar4 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar4 != (unsigned_long *)0x0) && ((*puVar4 & 1) == 0)) {
      ConstantVector::SetNull(result,true);
      return;
    }
    ConstantVector::SetNull(result,false);
    aVar24 = (anon_struct_16_3_d7536bce_for_pointer)
             UnaryLambdaWrapperWithNulls::
             Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                       ((date_t)*piVar3,&local_c8,idx,(void *)count);
    paVar2->pointer = aVar24;
  }
  else {
    pvVar14 = (void *)count;
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar19 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        _Var6._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
        piVar20 = (idx_t *)(pdVar19 + 8);
        uVar21 = 0;
        iVar15 = extraout_RDX_01;
        do {
          uVar16 = uVar21;
          if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
              _Var6._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
            uVar16 = (ulong)*(uint *)((long)_Var6._M_t.
                                            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                            .super__Head_base<0UL,_unsigned_long_*,_false>.
                                            _M_head_impl + uVar21 * 4);
          }
          sVar23 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)((long)(_func_int ***)local_78.data + uVar16 * 4),
                              &local_c8,iVar15,pvVar14);
          iVar15 = sVar23.value._8_8_;
          piVar20[-1] = sVar23.value._0_8_;
          *piVar20 = iVar15;
          uVar21 = uVar21 + 1;
          piVar20 = piVar20 + 2;
        } while (count != uVar21);
      }
    }
    else if (count != 0) {
      _Var6._M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
           (((unsafe_unique_array<unsigned_long> *)&(local_78.sel)->sel_vector)->
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
      pdVar19 = pdVar19 + 8;
      uVar21 = 0;
      do {
        uVar16 = uVar21;
        if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
            _Var6._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
          uVar16 = (ulong)*(uint *)((long)_Var6._M_t.
                                          super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                          .super__Head_base<0UL,_unsigned_long_*,_false>.
                                          _M_head_impl + uVar21 * 4);
        }
        if (((ulong)local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                    [uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var10 = p_Stack_a0;
            peVar9 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar9;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var10;
            if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
            }
            if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 (unsigned_long *)
                 (pTVar13->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
          }
          bVar8 = (byte)uVar21 & 0x3f;
          puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                   (uVar21 >> 6);
          *puVar1 = *puVar1 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          sVar23 = UnaryLambdaWrapperWithNulls::
                   Operation<duckdb::StrfTimeFormat::ConvertDateVector(duckdb::Vector&,duckdb::Vector&,unsigned_long)::__0,duckdb::date_t,duckdb::string_t>
                             ((date_t)*(int32_t *)((long)(_func_int ***)local_78.data + uVar16 * 4),
                              &local_c8,uVar16 >> 6,
                              (void *)local_78.validity.super_TemplatedValidityMask<unsigned_long>.
                                      validity_mask[uVar16 >> 6]);
          *(long *)(pdVar19 + -8) = sVar23.value._0_8_;
          *(long *)pdVar19 = sVar23.value._8_8_;
        }
        uVar21 = uVar21 + 1;
        pdVar19 = pdVar19 + 0x10;
      } while (count != uVar21);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void StrfTimeFormat::ConvertDateVector(Vector &input, Vector &result, idx_t count) {
	D_ASSERT(input.GetType().id() == LogicalTypeId::DATE);
	D_ASSERT(result.GetType().id() == LogicalTypeId::VARCHAR);
	UnaryExecutor::ExecuteWithNulls<date_t, string_t>(
	    input, result, count, [&](date_t input, ValidityMask &mask, idx_t idx) {
		    if (Date::IsFinite(input)) {
			    dtime_t time(0);
			    idx_t len = GetLength(input, time, 0, nullptr);
			    string_t target = StringVector::EmptyString(result, len);
			    FormatString(input, time, target.GetDataWriteable());
			    target.Finalize();
			    return target;
		    } else {
			    return StringVector::AddString(result, Date::ToString(input));
		    }
	    });
}